

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylehelper.cpp
# Opt level: O3

bool QStyleHelper::hasAncestor(QObject *obj,Role role)

{
  Role RVar1;
  long *plVar2;
  QObject *pQVar3;
  bool bVar4;
  
  if (obj != (QObject *)0x0) {
    pQVar3 = *(QObject **)(*(long *)(obj + 8) + 0x10);
    if (pQVar3 == (QObject *)0x0) {
      bVar4 = false;
    }
    else {
      do {
        plVar2 = (long *)QAccessible::queryAccessibleInterface(pQVar3);
        if (plVar2 == (long *)0x0) {
          bVar4 = false;
        }
        else {
          RVar1 = (**(code **)(*plVar2 + 0x78))(plVar2);
          bVar4 = RVar1 == role;
        }
        pQVar3 = *(QObject **)(*(long *)(pQVar3 + 8) + 0x10);
      } while ((pQVar3 != (QObject *)0x0) && (bVar4 == false));
    }
    return bVar4;
  }
  return false;
}

Assistant:

bool hasAncestor(QObject *obj, QAccessible::Role role)
{
    bool found = false;
    QObject *parent = obj ? obj->parent() : nullptr;
    while (parent && !found) {
        if (isInstanceOf(parent, role))
            found = true;
        parent = parent->parent();
    }
    return found;
}